

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O0

uint __thiscall
FuncInfo::FindOrAddInlineCacheId
          (FuncInfo *this,RegSlot instanceSlot,PropertyId propertySlot,bool isLoadMethod,
          bool isStore)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *this_01;
  Type *pTVar7;
  undefined1 local_bc [8];
  InlineCacheUnit cacheIdUnit;
  TrackAllocData local_a0;
  SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *local_78;
  InlineCacheList *cacheList;
  undefined8 local_68;
  TrackAllocData local_60;
  uint local_34;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_30;
  uint cacheId;
  InlineCacheIdMap *properties;
  PropertyId local_20;
  bool isStore_local;
  RegSlot RStack_1c;
  bool isLoadMethod_local;
  PropertyId propertySlot_local;
  RegSlot instanceSlot_local;
  FuncInfo *this_local;
  
  properties._6_1_ = isStore;
  properties._7_1_ = isLoadMethod;
  local_20 = propertySlot;
  RStack_1c = instanceSlot;
  _propertySlot_local = this;
  if (instanceSlot == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x294,"(instanceSlot != Js::Constants::NoRegister)",
                       "instanceSlot != Js::Constants::NoRegister");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (local_20 == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x295,"(propertySlot != Js::Constants::NoProperty)",
                       "propertySlot != Js::Constants::NoProperty");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((properties._7_1_ & 1) != 0) && ((properties._6_1_ & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x296,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((properties._6_1_ & 1) != 0) {
    if (local_20 == 0x178) {
      local_34 = NewInlineCache(this);
      SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Prepend
                (&this->toStringStoreCacheIds,this->alloc,&local_34);
      return local_34;
    }
    if (local_20 == 0x18e) {
      local_34 = NewInlineCache(this);
      SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Prepend
                (&this->valueOfStoreCacheIds,this->alloc,&local_34);
      return local_34;
    }
  }
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>
                    (this->inlineCacheMap,&stack0xffffffffffffffe4,&stack0xffffffffffffffd0);
  if (!bVar3) {
    pAVar6 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,
               (type_info *)
               &JsUtil::
                BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
               ,0x2b2);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_60);
    cacheList = (InlineCacheList *)Memory::ArenaAllocator::Alloc;
    local_68 = 0;
    this_00 = (BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar6,0x3f67b0);
    JsUtil::
    BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,this->alloc,0x11);
    pBStack_30 = this_00;
    JsUtil::
    BaseDictionary<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(this->inlineCacheMap,&stack0xffffffffffffffe4,&stack0xffffffffffffffd0);
  }
  bVar3 = JsUtil::
          BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<int>(pBStack_30,&local_20,&local_78);
  if (!bVar3) {
    pAVar6 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a0,
               (type_info *)&SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
               ,0x2b9);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_a0);
    cacheIdUnit.field_0._4_8_ = Memory::ArenaAllocator::Alloc;
    this_01 = (SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar6,0x3f67b0);
    SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::SList(this_01,this->alloc);
    local_78 = this_01;
    JsUtil::
    BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(pBStack_30,&local_20,&local_78);
  }
  bVar3 = Js::FunctionBody::ShouldShareInlineCaches();
  if ((bVar3) &&
     (uVar4 = RealCount::Count(&(local_78->
                                super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>)
                                .super_RealCount), 1 < uVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x2be,
                       "(!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1)",
                       "!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  InlineCacheUnit::InlineCacheUnit((InlineCacheUnit *)local_bc);
  bVar3 = Js::FunctionBody::ShouldShareInlineCaches();
  if ((!bVar3) ||
     (bVar3 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Empty
                        (&local_78->
                          super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>),
     bVar3)) {
    local_34 = NewInlineCache(this);
    bVar3 = Js::FunctionBody::ShouldShareInlineCaches();
    if (bVar3) {
      if ((properties._7_1_ & 1) == 0) {
        if ((properties._6_1_ & 1) == 0) {
          cacheIdUnit.field_0.field_0.loadCacheId = 0xffffffff;
          local_bc._0_4_ = local_34;
        }
        else {
          local_bc._0_4_ = 0xffffffff;
          cacheIdUnit.field_0.field_0.loadCacheId = local_34;
        }
        local_bc._4_4_ = 0xffffffff;
      }
      else {
        local_bc._4_4_ = local_34;
        local_bc._0_4_ = 0xffffffff;
        cacheIdUnit.field_0.field_0.loadCacheId = 0xffffffff;
      }
    }
    else {
      local_bc._0_4_ = local_34;
    }
    SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Prepend
              (local_78,(InlineCacheUnit *)local_bc);
  }
  else {
    pTVar7 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Head
                       (&local_78->
                         super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>);
    uVar1 = *(undefined8 *)&pTVar7->field_0;
    cacheIdUnit.field_0.field_0.loadCacheId = *(uint *)((long)&pTVar7->field_0 + 8);
    local_bc = (undefined1  [8])uVar1;
    if ((properties._7_1_ & 1) == 0) {
      if ((properties._6_1_ & 1) == 0) {
        local_bc._0_4_ = (undefined4)uVar1;
        bVar3 = local_bc._0_4_ == 0xffffffff;
        if (bVar3) {
          uVar4 = NewInlineCache(this);
          local_bc._0_4_ = uVar4;
        }
        local_34 = local_bc._0_4_;
      }
      else {
        if (cacheIdUnit.field_0.field_0.loadCacheId == 0xffffffff) {
          cacheIdUnit.field_0.field_0.loadCacheId = NewInlineCache(this);
        }
        local_34 = cacheIdUnit.field_0.field_0.loadCacheId;
      }
    }
    else {
      local_bc._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
      bVar3 = local_bc._4_4_ == 0xffffffff;
      if (bVar3) {
        uVar4 = NewInlineCache(this);
        local_bc._4_4_ = uVar4;
      }
      local_34 = local_bc._4_4_;
    }
    pTVar7 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Head
                       (&local_78->
                         super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>);
    *(undefined1 (*) [8])&pTVar7->field_0 = local_bc;
    (pTVar7->field_0).field_0.storeCacheId = cacheIdUnit.field_0.field_0.loadCacheId;
  }
  return local_34;
}

Assistant:

uint FindOrAddInlineCacheId(Js::RegSlot instanceSlot, Js::PropertyId propertySlot, bool isLoadMethod, bool isStore)
    {
        Assert(instanceSlot != Js::Constants::NoRegister);
        Assert(propertySlot != Js::Constants::NoProperty);
        Assert(!isLoadMethod || !isStore);

        InlineCacheIdMap *properties;
        uint cacheId;

        if (isStore)
        {
            // ... = foo.toString;
            // foo.toString = ...;

            // We need a new cache here to ensure SetProperty() is called, which will set the side-effect bit
            // on the scriptContext.
            switch (propertySlot)
            {
            case Js::PropertyIds::valueOf:
                cacheId = this->NewInlineCache();
                valueOfStoreCacheIds.Prepend(alloc, cacheId);
                return cacheId;

            case Js::PropertyIds::toString:
                cacheId = this->NewInlineCache();
                toStringStoreCacheIds.Prepend(alloc, cacheId);
                return cacheId;
            };
        }

        if (!inlineCacheMap->TryGetValue(instanceSlot, &properties))
        {
            properties = Anew(alloc, InlineCacheIdMap, alloc, 17);
            inlineCacheMap->Add(instanceSlot, properties);
        }

        InlineCacheList* cacheList;
        if (!properties->TryGetValue(propertySlot, &cacheList))
        {
            cacheList = Anew(alloc, InlineCacheList, alloc);
            properties->Add(propertySlot, cacheList);
        }

        // If we share inline caches we should never have more than one entry in the list.
        Assert(!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1);

        InlineCacheUnit cacheIdUnit;

        if (Js::FunctionBody::ShouldShareInlineCaches() && !cacheList->Empty())
        {
            cacheIdUnit = cacheList->Head();
            if (isLoadMethod)
            {
                if (cacheIdUnit.loadMethodCacheId == (uint)-1)
                {
                    cacheIdUnit.loadMethodCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.loadMethodCacheId;
            }
            else if (isStore)
            {
                if (cacheIdUnit.storeCacheId == (uint)-1)
                {
                    cacheIdUnit.storeCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.storeCacheId;
            }
            else
            {
                if (cacheIdUnit.loadCacheId == (uint)-1)
                {
                    cacheIdUnit.loadCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.loadCacheId;
            }
            cacheList->Head() = cacheIdUnit;
        }
        else
        {
            cacheId = this->NewInlineCache();
            if (Js::FunctionBody::ShouldShareInlineCaches())
            {
                if (isLoadMethod)
                {
                    cacheIdUnit.loadCacheId = (uint)-1;
                    cacheIdUnit.loadMethodCacheId = cacheId;
                    cacheIdUnit.storeCacheId = (uint)-1;
                }
                else if (isStore)
                {
                    cacheIdUnit.loadCacheId = (uint)-1;
                    cacheIdUnit.loadMethodCacheId = (uint)-1;
                    cacheIdUnit.storeCacheId = cacheId;
                }
                else
                {
                    cacheIdUnit.loadCacheId = cacheId;
                    cacheIdUnit.loadMethodCacheId = (uint)-1;
                    cacheIdUnit.storeCacheId = (uint)-1;
                }
            }
            else
            {
                cacheIdUnit.cacheId = cacheId;
            }
            cacheList->Prepend(cacheIdUnit);
        }

        return cacheId;
    }